

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

size_t readUTF8Char(uint8_t *dest,char *src)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t state;
  uint32_t codep;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_30 = 0;
  sVar2 = 0;
  do {
    uVar1 = decode(&local_30,&local_2c,src[sVar2]);
    if (uVar1 == 1) {
      return 0;
    }
    if (dest != (uint8_t *)0x0) {
      dest[sVar2] = src[sVar2];
    }
    sVar2 = sVar2 + 1;
  } while (local_30 != 0);
  return sVar2;
}

Assistant:

size_t readUTF8Char(uint8_t *dest, char const *src)
{
	uint32_t state = 0;
	uint32_t codep;
	size_t i = 0;

	for (;;) {
		if (decode(&state, &codep, src[i]) == 1)
			return 0;

		if (dest)
			dest[i] = src[i];
		i++;

		if (state == 0)
			return i;
	}
}